

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned-mem-pool.h
# Opt level: O1

void __thiscall cnn::AlignedMemoryPool<6U>::sys_alloc(AlignedMemoryPool<6U> *this,size_t cap)

{
  ulong n;
  void *pvVar1;
  
  n = (ulong)((cap & 0x3f) != 0) * 0x40 + cap & 0xffffffffffffffc0;
  this->capacity = n;
  if (this->shared == true) {
    pvVar1 = mmap((void *)0x0,n,3,0x21,-1,0);
  }
  else {
    pvVar1 = cnn_mm_malloc(n,0x40);
  }
  this->mem = pvVar1;
  this->used = 0;
  return;
}

Assistant:

void sys_alloc(size_t cap) {
    capacity = round_up_align(cap);
    if (shared) {
      mem = mmap(NULL, capacity, PROT_READ|PROT_WRITE, MAP_ANON|MAP_SHARED, -1, 0);
    }
    else {
      mem = cnn_mm_malloc(capacity, 1 << AlignedBits);
    }
    used = 0;
  }